

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

long ov_read_float(OggVorbis_File *vf,float ***pcm_channels,int length,int *bitstream)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar4;
  float **pcm;
  float **local_38;
  
  iVar1 = vf->ready_state;
  lVar4 = -0x83;
  if (1 < iVar1) {
    piVar3 = bitstream;
    iVar2 = length;
    while( true ) {
      if ((iVar1 == 4) &&
         (iVar1 = vorbis_synthesis_pcmout(&vf->vd,&local_38), iVar2 = extraout_EDX, iVar1 != 0)) {
        iVar2 = vorbis_synthesis_halfrate_p(vf->vi);
        if (pcm_channels != (float ***)0x0) {
          *pcm_channels = local_38;
        }
        if (iVar1 < length) {
          length = iVar1;
        }
        lVar4 = (long)length;
        vorbis_synthesis_read(&vf->vd,length);
        vf->pcm_offset = vf->pcm_offset + (lVar4 << ((byte)iVar2 & 0x3f));
        if (bitstream == (int *)0x0) {
          return lVar4;
        }
        *bitstream = vf->current_link;
        return lVar4;
      }
      iVar1 = _fetch_and_process_packet(vf,(ogg_packet *)0x1,iVar2,(int)piVar3);
      if (iVar1 == -2) {
        return 0;
      }
      if (iVar1 < 1) break;
      iVar1 = vf->ready_state;
      iVar2 = extraout_EDX_00;
    }
    lVar4 = (long)iVar1;
  }
  return lVar4;
}

Assistant:

long ov_read_float(OggVorbis_File *vf,float ***pcm_channels,int length,
                   int *bitstream){

  if(vf->ready_state<OPENED)return(OV_EINVAL);

  while(1){
    if(vf->ready_state==INITSET){
      float **pcm;
      long samples=vorbis_synthesis_pcmout(&vf->vd,&pcm);
      if(samples){
        int hs=vorbis_synthesis_halfrate_p(vf->vi);
        if(pcm_channels)*pcm_channels=pcm;
        if(samples>length)samples=length;
        vorbis_synthesis_read(&vf->vd,samples);
        vf->pcm_offset+=samples<<hs;
        if(bitstream)*bitstream=vf->current_link;
        return samples;

      }
    }

    /* suck in another packet */
    {
      int ret=_fetch_and_process_packet(vf,NULL,1,1);
      if(ret==OV_EOF)return(0);
      if(ret<=0)return(ret);
    }

  }
}